

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O1

void pele::physics::turbinflow::TurbInflow::read_one_turb_plane(TurbParm *a_tp,int iplane,int k)

{
  pointer pcVar1;
  FArrayBox *pFVar2;
  undefined8 uVar3;
  char cVar4;
  int destcomp;
  string turb_data;
  FArrayBox tmp;
  Box srcBox;
  Box dstBox;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [72];
  Box local_278;
  Box local_258;
  long local_238 [4];
  int aiStack_218 [122];
  
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  pcVar1 = (a_tp->m_turb_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e0,pcVar1,pcVar1 + (a_tp->m_turb_file)._M_string_length);
  std::__cxx11::string::append((char *)&local_2e0);
  std::ifstream::ifstream(local_238,local_2e0._M_dataplus._M_p,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                   "Unable to open input file ",&local_2e0);
    amrex::Abort((string *)local_2c0);
    if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
  }
  pFVar2 = a_tp->sdata;
  local_258.smallend.vect._0_8_ =
       *(undefined8 *)(pFVar2->super_BaseFab<double>).domain.smallend.vect;
  uVar3 = *(undefined8 *)(pFVar2->super_BaseFab<double>).domain.bigend.vect;
  local_258.bigend.vect[0] = (int)uVar3;
  local_258.bigend.vect[1] = (int)((ulong)uVar3 >> 0x20);
  local_258.btype.itype =
       (uint)((ulong)*(undefined8 *)((pFVar2->super_BaseFab<double>).domain.bigend.vect + 2) >> 0x20
             );
  local_258.bigend.vect[2] = iplane;
  destcomp = 0;
  local_258.smallend.vect[2] = iplane;
  do {
    std::istream::seekg((long)local_238,(_Ios_Seekdir)a_tp->offset[a_tp->kmax * destcomp + k + 1]);
    if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
      amrex::Abort_host("getplane(): seekg() failed");
    }
    amrex::FArrayBox::FArrayBox((FArrayBox *)local_2c0);
    amrex::FArrayBox::readFrom((FArrayBox *)local_2c0,(istream *)local_238);
    local_278.bigend.vect[2] = local_2c0._44_4_;
    local_278.btype.itype = local_2c0._48_4_;
    local_278.smallend.vect[0] = local_2c0._24_4_;
    local_278.smallend.vect[1] = local_2c0._28_4_;
    amrex::BaseFab<double>::copy<(amrex::RunOn)0>
              (&a_tp->sdata->super_BaseFab<double>,(BaseFab<double> *)local_2c0,&local_278,0,
               &local_258,destcomp,1);
    local_2c0._0_8_ = &PTR__BaseFab_0074eb90;
    amrex::BaseFab<double>::clear((BaseFab<double> *)local_2c0);
    destcomp = destcomp + 1;
  } while (destcomp != 3);
  std::ifstream::close();
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
TurbInflow::read_one_turb_plane(TurbParm& a_tp, int iplane, int k)
{
  // There are AMREX_SPACEDIM * kmax planes of FABs.
  // The first component are in the first kmax planes,
  // the second component in the next kmax planes, ....
  // Note also that both (*plane) and (*ncomp) start from
  // 1 not 0 since they're passed from Fortran.

  std::string turb_data = a_tp.m_turb_file + "/DAT";
  std::ifstream ifs(turb_data.c_str());
  if (!ifs.is_open()) {
    amrex::Abort("Unable to open input file " + turb_data);
  }

  amrex::Box dstBox = a_tp.sdata->box();
  dstBox.setSmall(2, iplane);
  dstBox.setBig(2, iplane);

  for (int n = 0; n < AMREX_SPACEDIM; ++n) {

    const long offset_idx = (k + 1) + (n * a_tp.kmax);
    AMREX_ASSERT_WITH_MESSAGE(
      offset_idx < a_tp.offset_size, "Bad turb fab offset idx");

    const long start = a_tp.offset[offset_idx];

    ifs.seekg(start, std::ios::beg);

    if (!ifs.good()) {
      amrex::Abort("getplane(): seekg() failed");
    }

    amrex::FArrayBox tmp;
    tmp.readFrom(ifs);
    amrex::Box srcBox = tmp.box();

    a_tp.sdata->copy<amrex::RunOn::Device>(tmp, srcBox, 0, dstBox, n, 1);
  }
  ifs.close();
}